

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int operation_wait(cubeb_conflict *ctx,pa_stream *stream,pa_operation *o)

{
  pa_operation_state_t pVar1;
  pa_context_state_t x;
  int iVar2;
  pa_stream_state_t x_00;
  pa_operation *in_RDX;
  pa_stream *in_RSI;
  long in_RDI;
  
  while( true ) {
    pVar1 = (*cubeb_pa_operation_get_state)(in_RDX);
    if (pVar1 != PA_OPERATION_RUNNING) {
      return 0;
    }
    (*cubeb_pa_threaded_mainloop_wait)(*(pa_threaded_mainloop **)(in_RDI + 0x10));
    x = (*cubeb_pa_context_get_state)(*(pa_context **)(in_RDI + 0x18));
    iVar2 = PA_CONTEXT_IS_GOOD(x);
    if (iVar2 == 0) break;
    if (in_RSI != (pa_stream *)0x0) {
      x_00 = (*cubeb_pa_stream_get_state)(in_RSI);
      iVar2 = PA_STREAM_IS_GOOD(x_00);
      if (iVar2 == 0) {
        return -1;
      }
    }
  }
  return -1;
}

Assistant:

static int
operation_wait(cubeb * ctx, pa_stream * stream, pa_operation * o)
{
  while (WRAP(pa_operation_get_state)(o) == PA_OPERATION_RUNNING) {
    WRAP(pa_threaded_mainloop_wait)(ctx->mainloop);
    if (!PA_CONTEXT_IS_GOOD(WRAP(pa_context_get_state)(ctx->context))) {
      return -1;
    }
    if (stream && !PA_STREAM_IS_GOOD(WRAP(pa_stream_get_state)(stream))) {
      return -1;
    }
  }
  return 0;
}